

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linei_intersector.h
# Opt level: O3

bool embree::avx::FlatLinearCurveMiIntersectorK<8,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Scene *pSVar10;
  Geometry *pGVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  ulong uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  byte bVar20;
  uint uVar21;
  ulong uVar22;
  float fVar23;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  float fVar33;
  undefined1 auVar26 [32];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar40;
  float fVar41;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  float fVar42;
  undefined1 auVar39 [32];
  float fVar46;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar47 [32];
  float fVar54;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  float fVar71;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar72 [64];
  undefined1 auVar79 [16];
  undefined1 auVar81 [64];
  float fVar82;
  undefined1 auVar83 [64];
  float in_register_0000151c;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  LineIntersectorHitM<8> hit;
  undefined1 local_360 [16];
  size_t local_348;
  undefined1 local_340 [32];
  RTCFilterFunctionNArguments local_310;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  RTCHitN local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  uint local_220;
  uint uStack_21c;
  uint uStack_218;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  uint uStack_208;
  uint uStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [2] [32];
  undefined1 auVar67 [64];
  undefined1 auVar80 [32];
  
  pSVar10 = context->scene;
  uVar21 = line->sharedGeomID;
  uVar2 = (line->v0).field_0.i[0];
  pGVar11 = (pSVar10->geometries).items[uVar21].ptr;
  lVar12 = *(long *)&pGVar11[1].time_range.upper;
  p_Var13 = pGVar11[1].intersectionFilterN;
  uVar3 = (line->v0).field_0.i[1];
  uVar4 = (line->v0).field_0.i[4];
  auVar24._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar4 * (long)p_Var13);
  auVar24._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar2 * (long)p_Var13);
  uVar5 = (line->v0).field_0.i[2];
  uVar6 = (line->v0).field_0.i[3];
  uVar7 = (line->v0).field_0.i[5];
  auVar37._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar7 * (long)p_Var13);
  auVar37._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar3 * (long)p_Var13);
  uVar8 = (line->v0).field_0.i[6];
  auVar47._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar8 * (long)p_Var13);
  auVar47._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar5 * (long)p_Var13);
  uVar9 = (line->v0).field_0.i[7];
  auVar55._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar9 * (long)p_Var13);
  auVar55._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)uVar6 * (long)p_Var13);
  auVar58._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar4 + 1) * (long)p_Var13);
  auVar58._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar2 + 1) * (long)p_Var13);
  auVar60._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar7 + 1) * (long)p_Var13);
  auVar60._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar3 + 1) * (long)p_Var13);
  auVar62._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar8 + 1) * (long)p_Var13);
  auVar62._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar5 + 1) * (long)p_Var13);
  auVar68._16_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar9 + 1) * (long)p_Var13);
  auVar68._0_16_ = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar6 + 1) * (long)p_Var13);
  auVar17 = vunpcklps_avx(auVar24,auVar47);
  auVar15 = vunpckhps_avx(auVar24,auVar47);
  auVar24 = vunpcklps_avx(auVar37,auVar55);
  auVar16 = vunpckhps_avx(auVar37,auVar55);
  auVar37 = vunpcklps_avx(auVar17,auVar24);
  local_2c0 = vunpckhps_avx(auVar17,auVar24);
  local_1c0 = vunpcklps_avx(auVar15,auVar16);
  auVar26 = vunpckhps_avx(auVar15,auVar16);
  auVar16 = vunpcklps_avx(auVar58,auVar62);
  auVar15 = vunpckhps_avx(auVar58,auVar62);
  auVar17 = vunpcklps_avx(auVar60,auVar68);
  auVar24 = vunpckhps_avx(auVar60,auVar68);
  local_180 = vunpcklps_avx(auVar16,auVar17);
  local_1a0 = vunpckhps_avx(auVar16,auVar17);
  local_200 = vunpcklps_avx(auVar15,auVar24);
  auVar35 = vpcmpeqd_avx(local_200._0_16_,local_200._0_16_);
  auVar36 = vpcmpeqd_avx(auVar35,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar35 = vpcmpeqd_avx(auVar35,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_160 = vunpckhps_avx(auVar15,auVar24);
  local_140._16_16_ = auVar35;
  local_140._0_16_ = auVar36;
  local_1d0 = vshufps_avx(ZEXT416(uVar21),ZEXT416(uVar21),0);
  local_1e0 = local_1d0;
  fVar46 = pre->ray_space[k].vy.field_0.m128[0];
  fVar23 = pre->ray_space[k].vy.field_0.m128[1];
  fVar27 = pre->ray_space[k].vz.field_0.m128[0];
  fVar28 = pre->ray_space[k].vz.field_0.m128[1];
  fVar29 = *(float *)(ray + k * 4 + 0x10);
  auVar65._4_4_ = fVar29;
  auVar65._0_4_ = fVar29;
  auVar65._8_4_ = fVar29;
  auVar65._12_4_ = fVar29;
  auVar65._16_4_ = fVar29;
  auVar65._20_4_ = fVar29;
  auVar65._24_4_ = fVar29;
  auVar65._28_4_ = fVar29;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar38._4_4_ = uVar1;
  auVar38._0_4_ = uVar1;
  auVar38._8_4_ = uVar1;
  auVar38._12_4_ = uVar1;
  auVar38._16_4_ = uVar1;
  auVar38._20_4_ = uVar1;
  auVar38._24_4_ = uVar1;
  auVar38._28_4_ = uVar1;
  auVar15 = vsubps_avx(local_2c0,auVar65);
  auVar16 = vsubps_avx(local_1c0,auVar38);
  fVar52 = auVar16._0_4_;
  fVar53 = auVar16._4_4_;
  fVar34 = auVar16._8_4_;
  fVar41 = auVar16._12_4_;
  fVar48 = auVar16._16_4_;
  fVar50 = auVar16._20_4_;
  fVar54 = auVar16._24_4_;
  fVar44 = auVar15._0_4_;
  fVar45 = auVar15._4_4_;
  fVar40 = auVar15._8_4_;
  fVar42 = auVar15._12_4_;
  fVar49 = auVar15._16_4_;
  fVar51 = auVar15._20_4_;
  fVar82 = auVar15._24_4_;
  fVar30 = pre->ray_space[k].vy.field_0.m128[2];
  fVar31 = pre->ray_space[k].vz.field_0.m128[2];
  fVar32 = pre->ray_space[k].vx.field_0.m128[0];
  uVar1 = *(undefined4 *)(ray + k * 4);
  auVar63._4_4_ = uVar1;
  auVar63._0_4_ = uVar1;
  auVar63._8_4_ = uVar1;
  auVar63._12_4_ = uVar1;
  auVar63._16_4_ = uVar1;
  auVar63._20_4_ = uVar1;
  auVar63._24_4_ = uVar1;
  auVar63._28_4_ = uVar1;
  auVar17 = vsubps_avx(auVar37,auVar63);
  fVar71 = auVar17._0_4_;
  fVar73 = auVar17._4_4_;
  fVar74 = auVar17._8_4_;
  fVar75 = auVar17._12_4_;
  fVar76 = auVar17._16_4_;
  fVar77 = auVar17._20_4_;
  fVar78 = auVar17._24_4_;
  auVar69._0_4_ = fVar71 * fVar32 + fVar46 * fVar44 + fVar27 * fVar52;
  auVar69._4_4_ = fVar73 * fVar32 + fVar46 * fVar45 + fVar27 * fVar53;
  auVar69._8_4_ = fVar74 * fVar32 + fVar46 * fVar40 + fVar27 * fVar34;
  auVar69._12_4_ = fVar75 * fVar32 + fVar46 * fVar42 + fVar27 * fVar41;
  auVar69._16_4_ = fVar76 * fVar32 + fVar46 * fVar49 + fVar27 * fVar48;
  auVar69._20_4_ = fVar77 * fVar32 + fVar46 * fVar51 + fVar27 * fVar50;
  auVar69._24_4_ = fVar78 * fVar32 + fVar46 * fVar82 + fVar27 * fVar54;
  auVar69._28_4_ = in_register_0000151c + auVar24._28_4_ + in_register_0000151c;
  fVar33 = pre->ray_space[k].vx.field_0.m128[1];
  auVar84._0_4_ = fVar71 * fVar33 + fVar28 * fVar52 + fVar23 * fVar44;
  auVar84._4_4_ = fVar73 * fVar33 + fVar28 * fVar53 + fVar23 * fVar45;
  auVar84._8_4_ = fVar74 * fVar33 + fVar28 * fVar34 + fVar23 * fVar40;
  auVar84._12_4_ = fVar75 * fVar33 + fVar28 * fVar41 + fVar23 * fVar42;
  auVar84._16_4_ = fVar76 * fVar33 + fVar28 * fVar48 + fVar23 * fVar49;
  auVar84._20_4_ = fVar77 * fVar33 + fVar28 * fVar50 + fVar23 * fVar51;
  auVar84._24_4_ = fVar78 * fVar33 + fVar28 * fVar54 + fVar23 * fVar82;
  auVar84._28_4_ = in_register_0000151c + in_register_0000151c + local_2c0._28_4_;
  fVar43 = pre->ray_space[k].vx.field_0.m128[2];
  auVar79._0_4_ = fVar71 * fVar43 + fVar44 * fVar30 + fVar52 * fVar31;
  auVar79._4_4_ = fVar73 * fVar43 + fVar45 * fVar30 + fVar53 * fVar31;
  auVar79._8_4_ = fVar74 * fVar43 + fVar40 * fVar30 + fVar34 * fVar31;
  auVar79._12_4_ = fVar75 * fVar43 + fVar42 * fVar30 + fVar41 * fVar31;
  auVar80._16_4_ = fVar76 * fVar43 + fVar49 * fVar30 + fVar48 * fVar31;
  auVar80._0_16_ = auVar79;
  auVar80._20_4_ = fVar77 * fVar43 + fVar51 * fVar30 + fVar50 * fVar31;
  auVar80._24_4_ = fVar78 * fVar43 + fVar82 * fVar30 + fVar54 * fVar31;
  auVar80._28_4_ = auVar17._28_4_ + auVar15._28_4_ + auVar16._28_4_;
  auVar15 = vsubps_avx(local_200,auVar38);
  fVar52 = auVar15._0_4_;
  fVar45 = auVar15._4_4_;
  fVar41 = auVar15._8_4_;
  fVar49 = auVar15._12_4_;
  fVar54 = auVar15._16_4_;
  fVar73 = auVar15._20_4_;
  fVar76 = auVar15._24_4_;
  auVar16 = vsubps_avx(local_1a0,auVar65);
  fVar44 = auVar16._0_4_;
  fVar34 = auVar16._4_4_;
  fVar42 = auVar16._8_4_;
  fVar50 = auVar16._12_4_;
  fVar82 = auVar16._16_4_;
  fVar74 = auVar16._20_4_;
  fVar77 = auVar16._24_4_;
  auVar17 = vsubps_avx(local_180,auVar63);
  fVar53 = auVar17._0_4_;
  fVar40 = auVar17._4_4_;
  fVar48 = auVar17._8_4_;
  fVar51 = auVar17._12_4_;
  fVar71 = auVar17._16_4_;
  fVar75 = auVar17._20_4_;
  fVar78 = auVar17._24_4_;
  auVar59._0_4_ = fVar32 * fVar53 + fVar27 * fVar52 + fVar46 * fVar44;
  auVar59._4_4_ = fVar32 * fVar40 + fVar27 * fVar45 + fVar46 * fVar34;
  auVar59._8_4_ = fVar32 * fVar48 + fVar27 * fVar41 + fVar46 * fVar42;
  auVar59._12_4_ = fVar32 * fVar51 + fVar27 * fVar49 + fVar46 * fVar50;
  auVar59._16_4_ = fVar32 * fVar71 + fVar27 * fVar54 + fVar46 * fVar82;
  auVar59._20_4_ = fVar32 * fVar75 + fVar27 * fVar73 + fVar46 * fVar74;
  auVar59._24_4_ = fVar32 * fVar78 + fVar27 * fVar76 + fVar46 * fVar77;
  auVar59._28_4_ = auVar16._28_4_ + local_200._28_4_ + fVar29;
  auVar61._0_4_ = fVar23 * fVar44 + fVar28 * fVar52 + fVar33 * fVar53;
  auVar61._4_4_ = fVar23 * fVar34 + fVar28 * fVar45 + fVar33 * fVar40;
  auVar61._8_4_ = fVar23 * fVar42 + fVar28 * fVar41 + fVar33 * fVar48;
  auVar61._12_4_ = fVar23 * fVar50 + fVar28 * fVar49 + fVar33 * fVar51;
  auVar61._16_4_ = fVar23 * fVar82 + fVar28 * fVar54 + fVar33 * fVar71;
  auVar61._20_4_ = fVar23 * fVar74 + fVar28 * fVar73 + fVar33 * fVar75;
  auVar61._24_4_ = fVar23 * fVar77 + fVar28 * fVar76 + fVar33 * fVar78;
  auVar61._28_4_ = local_200._28_4_ + fVar27 + fVar33;
  auVar25._0_4_ = fVar43 * fVar53 + fVar30 * fVar44 + fVar31 * fVar52;
  auVar25._4_4_ = fVar43 * fVar40 + fVar30 * fVar34 + fVar31 * fVar45;
  auVar25._8_4_ = fVar43 * fVar48 + fVar30 * fVar42 + fVar31 * fVar41;
  auVar25._12_4_ = fVar43 * fVar51 + fVar30 * fVar50 + fVar31 * fVar49;
  auVar25._16_4_ = fVar43 * fVar71 + fVar30 * fVar82 + fVar31 * fVar54;
  auVar25._20_4_ = fVar43 * fVar75 + fVar30 * fVar74 + fVar31 * fVar73;
  auVar25._24_4_ = fVar43 * fVar78 + fVar30 * fVar77 + fVar31 * fVar76;
  auVar25._28_4_ = fVar33 + fVar30 + auVar15._28_4_;
  auVar16 = vsubps_avx(auVar59,auVar69);
  auVar24 = vsubps_avx(auVar61,auVar84);
  fVar46 = auVar24._0_4_;
  fVar27 = auVar24._4_4_;
  fVar29 = auVar24._8_4_;
  fVar31 = auVar24._12_4_;
  fVar33 = auVar24._16_4_;
  fVar52 = auVar24._20_4_;
  fVar53 = auVar24._24_4_;
  fVar23 = auVar16._0_4_;
  fVar28 = auVar16._4_4_;
  fVar30 = auVar16._8_4_;
  fVar32 = auVar16._12_4_;
  fVar43 = auVar16._16_4_;
  fVar44 = auVar16._20_4_;
  fVar45 = auVar16._24_4_;
  auVar56._0_4_ = fVar23 * fVar23 + fVar46 * fVar46;
  auVar56._4_4_ = fVar28 * fVar28 + fVar27 * fVar27;
  auVar56._8_4_ = fVar30 * fVar30 + fVar29 * fVar29;
  auVar56._12_4_ = fVar32 * fVar32 + fVar31 * fVar31;
  auVar56._16_4_ = fVar43 * fVar43 + fVar33 * fVar33;
  auVar56._20_4_ = fVar44 * fVar44 + fVar52 * fVar52;
  auVar56._24_4_ = fVar45 * fVar45 + fVar53 * fVar53;
  auVar56._28_4_ = auVar59._28_4_ + auVar17._28_4_;
  auVar17._4_4_ = fVar27 * -auVar84._4_4_;
  auVar17._0_4_ = fVar46 * -auVar84._0_4_;
  auVar17._8_4_ = fVar29 * -auVar84._8_4_;
  auVar17._12_4_ = fVar31 * -auVar84._12_4_;
  auVar17._16_4_ = fVar33 * -auVar84._16_4_;
  auVar17._20_4_ = fVar52 * -auVar84._20_4_;
  auVar17._24_4_ = fVar53 * -auVar84._24_4_;
  auVar17._28_4_ = -auVar84._28_4_;
  auVar15 = vrcpps_avx(auVar56);
  auVar85._4_4_ = auVar69._4_4_ * fVar28;
  auVar85._0_4_ = auVar69._0_4_ * fVar23;
  auVar85._8_4_ = auVar69._8_4_ * fVar30;
  auVar85._12_4_ = auVar69._12_4_ * fVar32;
  auVar85._16_4_ = auVar69._16_4_ * fVar43;
  auVar85._20_4_ = auVar69._20_4_ * fVar44;
  auVar85._24_4_ = auVar69._24_4_ * fVar45;
  auVar85._28_4_ = uVar1;
  auVar17 = vsubps_avx(auVar17,auVar85);
  auVar64._8_4_ = 0x3f800000;
  auVar64._0_8_ = 0x3f8000003f800000;
  auVar64._12_4_ = 0x3f800000;
  auVar64._16_4_ = 0x3f800000;
  auVar64._20_4_ = 0x3f800000;
  auVar64._24_4_ = 0x3f800000;
  auVar64._28_4_ = 0x3f800000;
  fVar34 = auVar15._0_4_;
  fVar40 = auVar15._4_4_;
  auVar18._4_4_ = fVar40 * auVar56._4_4_;
  auVar18._0_4_ = fVar34 * auVar56._0_4_;
  fVar41 = auVar15._8_4_;
  auVar18._8_4_ = fVar41 * auVar56._8_4_;
  fVar42 = auVar15._12_4_;
  auVar18._12_4_ = fVar42 * auVar56._12_4_;
  fVar48 = auVar15._16_4_;
  auVar18._16_4_ = fVar48 * auVar56._16_4_;
  fVar49 = auVar15._20_4_;
  auVar18._20_4_ = fVar49 * auVar56._20_4_;
  fVar50 = auVar15._24_4_;
  auVar18._24_4_ = fVar50 * auVar56._24_4_;
  auVar18._28_4_ = auVar56._28_4_;
  auVar85 = vsubps_avx(auVar64,auVar18);
  auVar19._4_4_ = auVar17._4_4_ * (fVar40 + fVar40 * auVar85._4_4_);
  auVar19._0_4_ = auVar17._0_4_ * (fVar34 + fVar34 * auVar85._0_4_);
  auVar19._8_4_ = auVar17._8_4_ * (fVar41 + fVar41 * auVar85._8_4_);
  auVar19._12_4_ = auVar17._12_4_ * (fVar42 + fVar42 * auVar85._12_4_);
  auVar19._16_4_ = auVar17._16_4_ * (fVar48 + fVar48 * auVar85._16_4_);
  auVar19._20_4_ = auVar17._20_4_ * (fVar49 + fVar49 * auVar85._20_4_);
  auVar19._24_4_ = auVar17._24_4_ * (fVar50 + fVar50 * auVar85._24_4_);
  auVar19._28_4_ = auVar15._28_4_ + auVar85._28_4_;
  auVar15 = vminps_avx(auVar19,auVar64);
  auVar85 = ZEXT1232(ZEXT412(0)) << 0x20;
  local_120 = vmaxps_avx(auVar15,auVar85);
  fVar82 = local_120._0_4_;
  fVar71 = local_120._4_4_;
  fVar73 = local_120._8_4_;
  fVar74 = local_120._12_4_;
  fVar75 = local_120._16_4_;
  fVar76 = local_120._20_4_;
  fVar77 = local_120._24_4_;
  fVar34 = auVar69._0_4_ + fVar82 * fVar23;
  fVar40 = auVar69._4_4_ + fVar71 * fVar28;
  fVar41 = auVar69._8_4_ + fVar73 * fVar30;
  fVar42 = auVar69._12_4_ + fVar74 * fVar32;
  fVar43 = auVar69._16_4_ + fVar75 * fVar43;
  fVar44 = auVar69._20_4_ + fVar76 * fVar44;
  fVar45 = auVar69._24_4_ + fVar77 * fVar45;
  fVar46 = auVar84._0_4_ + fVar82 * fVar46;
  fVar48 = auVar84._4_4_ + fVar71 * fVar27;
  fVar49 = auVar84._8_4_ + fVar73 * fVar29;
  fVar50 = auVar84._12_4_ + fVar74 * fVar31;
  fVar51 = auVar84._16_4_ + fVar75 * fVar33;
  fVar52 = auVar84._20_4_ + fVar76 * fVar52;
  fVar53 = auVar84._24_4_ + fVar77 * fVar53;
  fVar54 = auVar84._28_4_ + auVar24._28_4_;
  auVar15 = vsubps_avx(auVar25,auVar80);
  auVar17 = vsubps_avx(local_160,auVar26);
  local_e0._0_4_ = auVar79._0_4_ + fVar82 * auVar15._0_4_;
  local_e0._4_4_ = auVar79._4_4_ + fVar71 * auVar15._4_4_;
  local_e0._8_4_ = auVar79._8_4_ + fVar73 * auVar15._8_4_;
  local_e0._12_4_ = auVar79._12_4_ + fVar74 * auVar15._12_4_;
  local_e0._16_4_ = auVar80._16_4_ + fVar75 * auVar15._16_4_;
  local_e0._20_4_ = auVar80._20_4_ + fVar76 * auVar15._20_4_;
  local_e0._24_4_ = auVar80._24_4_ + fVar77 * auVar15._24_4_;
  local_e0._28_4_ = auVar80._28_4_ + auVar15._28_4_;
  fVar23 = auVar26._0_4_ + fVar82 * auVar17._0_4_;
  fVar27 = auVar26._4_4_ + fVar71 * auVar17._4_4_;
  fVar28 = auVar26._8_4_ + fVar73 * auVar17._8_4_;
  fVar29 = auVar26._12_4_ + fVar74 * auVar17._12_4_;
  fVar30 = auVar26._16_4_ + fVar75 * auVar17._16_4_;
  fVar31 = auVar26._20_4_ + fVar76 * auVar17._20_4_;
  fVar32 = auVar26._24_4_ + fVar77 * auVar17._24_4_;
  fVar33 = auVar26._28_4_ + auVar15._28_4_;
  auVar39._0_4_ = fVar34 * fVar34 + fVar46 * fVar46;
  auVar39._4_4_ = fVar40 * fVar40 + fVar48 * fVar48;
  auVar39._8_4_ = fVar41 * fVar41 + fVar49 * fVar49;
  auVar39._12_4_ = fVar42 * fVar42 + fVar50 * fVar50;
  auVar39._16_4_ = fVar43 * fVar43 + fVar51 * fVar51;
  auVar39._20_4_ = fVar44 * fVar44 + fVar52 * fVar52;
  auVar39._24_4_ = fVar45 * fVar45 + fVar53 * fVar53;
  auVar39._28_4_ = auVar69._28_4_ + auVar16._28_4_ + fVar54;
  auVar15._4_4_ = fVar27 * fVar27;
  auVar15._0_4_ = fVar23 * fVar23;
  auVar15._8_4_ = fVar28 * fVar28;
  auVar15._12_4_ = fVar29 * fVar29;
  auVar15._16_4_ = fVar30 * fVar30;
  auVar15._20_4_ = fVar31 * fVar31;
  auVar15._24_4_ = fVar32 * fVar32;
  auVar15._28_4_ = fVar54;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar57._4_4_ = uVar1;
  auVar57._0_4_ = uVar1;
  auVar57._8_4_ = uVar1;
  auVar57._12_4_ = uVar1;
  auVar57._16_4_ = uVar1;
  auVar57._20_4_ = uVar1;
  auVar57._24_4_ = uVar1;
  auVar57._28_4_ = uVar1;
  auVar16 = vcmpps_avx(auVar39,auVar15,2);
  auVar15 = vcmpps_avx(auVar57,local_e0,2);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar66._4_4_ = uVar1;
  auVar66._0_4_ = uVar1;
  auVar66._8_4_ = uVar1;
  auVar66._12_4_ = uVar1;
  auVar66._16_4_ = uVar1;
  auVar66._20_4_ = uVar1;
  auVar66._24_4_ = uVar1;
  auVar66._28_4_ = uVar1;
  auVar67 = ZEXT3264(auVar66);
  auVar17 = vcmpps_avx(local_e0,auVar66,2);
  auVar15 = vandps_avx(auVar17,auVar15);
  fVar46 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
  auVar15 = vandps_avx(auVar15,auVar16);
  auVar16._4_4_ = fVar46 * (fVar27 + fVar27);
  auVar16._0_4_ = fVar46 * (fVar23 + fVar23);
  auVar16._8_4_ = fVar46 * (fVar28 + fVar28);
  auVar16._12_4_ = fVar46 * (fVar29 + fVar29);
  auVar16._16_4_ = fVar46 * (fVar30 + fVar30);
  auVar16._20_4_ = fVar46 * (fVar31 + fVar31);
  auVar16._24_4_ = fVar46 * (fVar32 + fVar32);
  auVar16._28_4_ = fVar33 + fVar33;
  auVar16 = vcmpps_avx(local_e0,auVar16,6);
  auVar15 = vandps_avx(auVar16,auVar15);
  auVar35 = vpslld_avx(auVar15._0_16_,0x1f);
  auVar36 = vpsrad_avx(auVar35,0x1f);
  auVar35 = vpslld_avx(auVar15._16_16_,0x1f);
  auVar35 = vpsrad_avx(auVar35,0x1f);
  auVar26._16_16_ = auVar35;
  auVar26._0_16_ = auVar36;
  auVar15 = auVar26 & ~local_140;
  if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0x7f,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar15 >> 0xbf,0) != '\0') ||
      (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0') {
    auVar15 = vandnps_avx(local_140,auVar26);
    local_c0 = vsubps_avx(local_180,auVar37);
    local_a0 = vsubps_avx(local_1a0,local_2c0);
    local_80[0] = vsubps_avx(local_200,local_1c0);
    auVar16 = vcmpps_avx(auVar85,local_c0,4);
    auVar24 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar17 = vcmpps_avx(auVar24,local_a0,4);
    auVar17 = vorps_avx(auVar16,auVar17);
    auVar16 = vcmpps_avx(auVar24,local_80[0],4);
    auVar16 = vorps_avx(auVar17,auVar16);
    auVar17 = auVar15 & auVar16;
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0x7f,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0xbf,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0')
    {
      auVar15 = vandps_avx(auVar16,auVar15);
      local_100 = ZEXT832(0) << 0x20;
      uVar21 = vmovmskps_avx(auVar15);
      uVar22 = (ulong)uVar21;
      bVar20 = (byte)k;
      auVar15 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar70 = ZEXT3264(auVar15);
      auVar72 = ZEXT464(0) << 0x20;
      auVar35 = vpcmpeqd_avx(auVar79,auVar79);
      auVar81 = ZEXT1664(auVar35);
      auVar83 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      local_348 = k;
      do {
        local_310.hit = local_290;
        local_310.valid = (int *)local_360;
        uVar14 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
          }
        }
        uVar21 = *(uint *)(local_1e0 + uVar14 * 4);
        pGVar11 = (pSVar10->geometries).items[uVar21].ptr;
        if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            return true;
          }
          local_260 = *(undefined4 *)(local_120 + uVar14 * 4);
          uVar1 = *(undefined4 *)(local_100 + uVar14 * 4);
          local_250._4_4_ = uVar1;
          local_250._0_4_ = uVar1;
          local_250._8_4_ = uVar1;
          local_250._12_4_ = uVar1;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_e0 + uVar14 * 4);
          local_310.context = context->user;
          local_230 = vpshufd_avx(ZEXT416(uVar21),0);
          uVar21 = (line->primIDs).field_0.i[uVar14];
          local_240._4_4_ = uVar21;
          local_240._0_4_ = uVar21;
          local_240._8_4_ = uVar21;
          local_240._12_4_ = uVar21;
          uVar1 = *(undefined4 *)(local_c0 + uVar14 * 4);
          local_290._4_4_ = uVar1;
          local_290._0_4_ = uVar1;
          local_290._8_4_ = uVar1;
          local_290._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_a0 + uVar14 * 4);
          local_280._4_4_ = uVar1;
          local_280._0_4_ = uVar1;
          local_280._8_4_ = uVar1;
          local_280._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_80[0] + uVar14 * 4);
          local_270._4_4_ = uVar1;
          local_270._0_4_ = uVar1;
          local_270._8_4_ = uVar1;
          local_270._12_4_ = uVar1;
          local_340 = auVar70._0_32_;
          uStack_21c = (local_310.context)->instID[0];
          local_220 = uStack_21c;
          uStack_218 = uStack_21c;
          uStack_214 = uStack_21c;
          uStack_210 = (local_310.context)->instPrimID[0];
          uStack_20c = uStack_210;
          uStack_208 = uStack_210;
          uStack_204 = uStack_210;
          local_360 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << (bVar20 & 0x1f)) * 0x10)
          ;
          local_310.geometryUserPtr = pGVar11->userPtr;
          local_310.N = 4;
          local_2e0 = auVar67._0_32_;
          local_310.ray = (RTCRayN *)ray;
          uStack_25c = local_260;
          uStack_258 = local_260;
          uStack_254 = local_260;
          if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar35 = auVar81._0_16_;
            (*pGVar11->occlusionFilterN)(&local_310);
            auVar83 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
            auVar35 = vpcmpeqd_avx(auVar35,auVar35);
            auVar81 = ZEXT1664(auVar35);
            auVar72 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar70 = ZEXT3264(local_340);
            auVar67 = ZEXT3264(local_2e0);
            k = local_348;
          }
          auVar35 = auVar81._0_16_;
          if (local_360 == (undefined1  [16])0x0) {
            auVar36 = vpcmpeqd_avx(auVar72._0_16_,(undefined1  [16])0x0);
            auVar35 = auVar35 ^ auVar36;
          }
          else {
            p_Var13 = context->args->filter;
            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var13)(&local_310);
              auVar83 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              auVar35 = vpcmpeqd_avx(auVar35,auVar35);
              auVar81 = ZEXT1664(auVar35);
              auVar72 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar70 = ZEXT3264(local_340);
              auVar67 = ZEXT3264(local_2e0);
            }
            auVar36 = vpcmpeqd_avx(auVar72._0_16_,local_360);
            auVar35 = auVar81._0_16_ ^ auVar36;
            auVar36 = vblendvps_avx(auVar83._0_16_,*(undefined1 (*) [16])(local_310.ray + 0x80),
                                    auVar36);
            *(undefined1 (*) [16])(local_310.ray + 0x80) = auVar36;
          }
          auVar36._8_8_ = 0x100000001;
          auVar36._0_8_ = 0x100000001;
          if ((auVar36 & auVar35) != (undefined1  [16])0x0) {
            return true;
          }
          *(int *)(ray + k * 4 + 0x80) = auVar67._0_4_;
        }
        uVar22 = uVar22 ^ 1L << (uVar14 & 0x3f);
      } while (uVar22 != 0);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; line.gather(v0,v1,geom);
        const vbool<M> valid = line.valid();
        return FlatLinearCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }